

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int decompress(archive_read *a,_7zip *zip,void *buff,size_t *outbytes,void *b,size_t *used)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  uchar *puVar4;
  lzma_ret lVar5;
  int iVar6;
  uint uVar7;
  Bool BVar8;
  ssize_t sVar9;
  size_t sVar10;
  bool local_ee;
  uint8_t *local_e0;
  ssize_t bytes_2;
  size_t l;
  uint64_t uStack_b0;
  int sym;
  uint64_t flush_bytes;
  size_t bytes_1;
  size_t remaining;
  ssize_t bytes;
  uint local_88;
  int i;
  int ret;
  int r;
  size_t bcj2_avail_out;
  uint8_t *bcj2_next_out;
  size_t t_avail_out;
  size_t t_avail_in;
  size_t o_avail_out;
  size_t o_avail_in;
  uint8_t *t_next_out;
  uint8_t *t_next_in;
  size_t *used_local;
  void *b_local;
  size_t *outbytes_local;
  void *buff_local;
  _7zip *zip_local;
  archive_read *a_local;
  
  local_88 = 0;
  puVar1 = (uint8_t *)*used;
  puVar2 = (uint8_t *)*outbytes;
  bcj2_next_out = puVar2;
  o_avail_in = (size_t)buff;
  if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
    if ((puVar1 != (uint8_t *)0x0) && ((puVar2 < (uint8_t *)0x5 && (zip->odd_bcj_size != 0)))) {
      *used = 0;
      *outbytes = 0;
      return 0;
    }
    bytes._4_4_ = 0;
    o_avail_in = (size_t)buff;
    while (zip->odd_bcj_size != 0 && bcj2_next_out != (uint8_t *)0x0) {
      *(uchar *)o_avail_in = zip->odd_bcj[bytes._4_4_];
      bcj2_next_out = bcj2_next_out + -1;
      zip->odd_bcj_size = zip->odd_bcj_size - 1;
      bytes._4_4_ = bytes._4_4_ + 1;
      o_avail_in = o_avail_in + 1;
    }
    if ((puVar1 == (uint8_t *)0x0) || (bcj2_next_out == (uint8_t *)0x0)) {
      *used = 0;
      *outbytes = (long)puVar2 - (long)bcj2_next_out;
      local_88 = (uint)(puVar1 == (uint8_t *)0x0);
      return local_88;
    }
  }
  bcj2_avail_out = o_avail_in;
  _ret = bcj2_next_out;
  if (zip->codec2 == 0x303011b) {
    if (zip->tmp_stream_bytes_remaining != 0) {
      sVar10 = zip->tmp_stream_bytes_remaining;
      sVar9 = Bcj2_Decode(zip,(uint8_t *)o_avail_in,(size_t)bcj2_next_out);
      if (sVar9 < 0) {
        archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
        return -0x19;
      }
      zip->main_stream_bytes_remaining =
           zip->main_stream_bytes_remaining - (sVar10 - zip->tmp_stream_bytes_remaining);
      _ret = bcj2_next_out + -sVar9;
      if ((puVar1 == (uint8_t *)0x0) || (_ret == (uint8_t *)0x0)) {
        *used = 0;
        *outbytes = (long)puVar2 - (long)_ret;
        if ((puVar1 == (uint8_t *)0x0) && (zip->tmp_stream_bytes_remaining != 0)) {
          local_88 = 1;
        }
        return local_88;
      }
      bcj2_avail_out = sVar9 + o_avail_in;
    }
    o_avail_in = (size_t)zip->tmp_stream_buff;
    bcj2_next_out = (uint8_t *)zip->tmp_stream_buff_size;
  }
  uVar3 = zip->codec;
  if (uVar3 == 0) {
    local_e0 = puVar1;
    if (bcj2_next_out < puVar1) {
      local_e0 = bcj2_next_out;
    }
    memcpy((void *)o_avail_in,b,(size_t)local_e0);
    t_avail_out = (long)puVar1 - (long)local_e0;
    bcj2_next_out = bcj2_next_out + -(long)local_e0;
    local_88 = (uint)(puVar1 == (uint8_t *)0x0);
  }
  else if ((uVar3 == 0x21) || (uVar3 == 0x30101)) {
    (zip->lzstream).next_in = (uint8_t *)b;
    (zip->lzstream).avail_in = (size_t)puVar1;
    (zip->lzstream).next_out = (uint8_t *)o_avail_in;
    (zip->lzstream).avail_out = (size_t)bcj2_next_out;
    lVar5 = lzma_code(&zip->lzstream,LZMA_RUN);
    if (lVar5 != LZMA_OK) {
      if (lVar5 != LZMA_STREAM_END) {
        archive_set_error(&a->archive,-1,"Decompression failed(%d)",(ulong)lVar5);
        return -0x19;
      }
      lzma_end(&zip->lzstream);
      zip->lzstream_valid = 0;
      local_88 = 1;
    }
    t_avail_out = (zip->lzstream).avail_in;
    bcj2_next_out = (uint8_t *)(zip->lzstream).avail_out;
  }
  else if (uVar3 == 0x30401) {
    if (((zip->ppmd7_valid == 0) || (zip->ppmd7_stat < 0)) || (bcj2_next_out == (uint8_t *)0x0)) {
      archive_set_error(&a->archive,-1,"Decompression internal error");
      return -0x19;
    }
    (zip->ppstream).next_in = (uchar *)b;
    (zip->ppstream).avail_in = (int64_t)puVar1;
    (zip->ppstream).next_out = (uchar *)o_avail_in;
    (zip->ppstream).avail_out = (int64_t)bcj2_next_out;
    if (zip->ppmd7_stat == 0) {
      (zip->bytein).a = a;
      (zip->bytein).Read = ppmd_read;
      (zip->range_dec).Stream = &zip->bytein;
      BVar8 = Ppmd7z_RangeDec_Init(&zip->range_dec);
      if (BVar8 == 0) {
        zip->ppmd7_stat = -1;
        archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decorder");
        return -0x19;
      }
      if ((zip->ppstream).overconsumed != 0) {
        zip->ppmd7_stat = -1;
        return -0x19;
      }
      zip->ppmd7_stat = 1;
    }
    if (puVar1 == (uint8_t *)0x0) {
      uStack_b0 = zip->folder_outbytes_remaining;
    }
    else {
      uStack_b0 = 0;
    }
    do {
      iVar6 = Ppmd7_DecodeSymbol(&zip->ppmd7_context,&(zip->range_dec).p);
      if (iVar6 < 0) {
        zip->ppmd7_stat = -1;
        archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
        return -0x19;
      }
      if ((zip->ppstream).overconsumed != 0) {
        zip->ppmd7_stat = -1;
        return -0x19;
      }
      puVar4 = (zip->ppstream).next_out;
      (zip->ppstream).next_out = puVar4 + 1;
      *puVar4 = (uchar)iVar6;
      (zip->ppstream).avail_out = (zip->ppstream).avail_out + -1;
      (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
      if (uStack_b0 != 0) {
        uStack_b0 = uStack_b0 - 1;
      }
      local_ee = false;
      if ((zip->ppstream).avail_out != 0) {
        local_ee = (zip->ppstream).avail_in != 0 || uStack_b0 != 0;
      }
    } while (local_ee);
    t_avail_out = (zip->ppstream).avail_in;
    bcj2_next_out = (uint8_t *)(zip->ppstream).avail_out;
  }
  else {
    t_avail_out._0_4_ = (uint)puVar1;
    if (uVar3 == 0x40108) {
      (zip->stream).next_in = (Bytef *)b;
      (zip->stream).avail_in = (uint)t_avail_out;
      (zip->stream).next_out = (Bytef *)o_avail_in;
      (zip->stream).avail_out = (uint)bcj2_next_out;
      uVar7 = cm_zlib_inflate(&zip->stream,0);
      if (uVar7 != 0) {
        if (uVar7 != 1) {
          archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar7);
          return -0x19;
        }
        local_88 = 1;
      }
      t_avail_out = (size_t)(zip->stream).avail_in;
      bcj2_next_out = (uint8_t *)(ulong)(zip->stream).avail_out;
    }
    else {
      if (uVar3 != 0x40202) {
        archive_set_error(&a->archive,-1,"Decompression internal error");
        return -0x19;
      }
      (zip->bzstream).next_in = (char *)b;
      (zip->bzstream).avail_in = (uint)t_avail_out;
      (zip->bzstream).next_out = (char *)o_avail_in;
      (zip->bzstream).avail_out = (uint)bcj2_next_out;
      iVar6 = BZ2_bzDecompress(&zip->bzstream);
      if (iVar6 != 0) {
        if (iVar6 != 4) {
          archive_set_error(&a->archive,-1,"bzip decompression failed");
          return -0x19;
        }
        iVar6 = BZ2_bzDecompressEnd(&zip->bzstream);
        if (iVar6 != 0) {
          archive_set_error(&a->archive,-1,"Failed to clean up decompressor");
          return -0x19;
        }
        zip->bzstream_valid = 0;
        local_88 = 1;
      }
      t_avail_out = (size_t)(zip->bzstream).avail_in;
      bcj2_next_out = (uint8_t *)(ulong)(zip->bzstream).avail_out;
    }
  }
  if ((local_88 == 0) || (local_88 == 1)) {
    *used = (long)puVar1 - t_avail_out;
    *outbytes = (long)puVar2 - (long)bcj2_next_out;
    if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
      sVar10 = x86_Convert(zip,(uint8_t *)buff,*outbytes);
      zip->odd_bcj_size = *outbytes - sVar10;
      if ((((zip->odd_bcj_size == 0) || (4 < zip->odd_bcj_size)) || (puVar1 == (uint8_t *)0x0)) ||
         (local_88 == 1)) {
        zip->odd_bcj_size = 0;
      }
      else {
        memcpy(zip->odd_bcj,(void *)((long)buff + sVar10),zip->odd_bcj_size);
        *outbytes = sVar10;
      }
    }
    if (zip->codec2 == 0x303011b) {
      zip->tmp_stream_bytes_avail = zip->tmp_stream_buff_size - (long)bcj2_next_out;
      if (zip->main_stream_bytes_remaining < zip->tmp_stream_bytes_avail) {
        zip->tmp_stream_bytes_avail = zip->main_stream_bytes_remaining;
      }
      zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_avail;
      sVar9 = Bcj2_Decode(zip,(uint8_t *)bcj2_avail_out,(size_t)_ret);
      if (sVar9 < 0) {
        archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
        return -0x19;
      }
      zip->main_stream_bytes_remaining =
           zip->main_stream_bytes_remaining -
           (zip->tmp_stream_bytes_avail - zip->tmp_stream_bytes_remaining);
      *outbytes = (long)puVar2 - ((long)_ret - sVar9);
    }
  }
  return local_88;
}

Assistant:

static int
decompress(struct archive_read *a, struct _7zip *zip,
    void *buff, size_t *outbytes, const void *b, size_t *used)
{
	const uint8_t *t_next_in;
	uint8_t *t_next_out;
	size_t o_avail_in, o_avail_out;
	size_t t_avail_in, t_avail_out;
	uint8_t *bcj2_next_out;
	size_t bcj2_avail_out;
	int r, ret = ARCHIVE_OK;

	t_avail_in = o_avail_in = *used;
	t_avail_out = o_avail_out = *outbytes;
	t_next_in = b;
	t_next_out = buff;

	if (zip->codec != _7Z_LZMA2 && zip->codec2 == _7Z_X86) {
		int i;

		/* Do not copy out the BCJ remaining bytes when the output
		 * buffer size is less than five bytes. */
		if (o_avail_in != 0 && t_avail_out < 5 && zip->odd_bcj_size) {
			*used = 0;
			*outbytes = 0;
			return (ret);
		}
		for (i = 0; zip->odd_bcj_size > 0 && t_avail_out; i++) {
			*t_next_out++ = zip->odd_bcj[i];
			t_avail_out--;
			zip->odd_bcj_size--;
		}
		if (o_avail_in == 0 || t_avail_out == 0) {
			*used = o_avail_in - t_avail_in;
			*outbytes = o_avail_out - t_avail_out;
			if (o_avail_in == 0)
				ret = ARCHIVE_EOF;
			return (ret);
		}
	}

	bcj2_next_out = t_next_out;
	bcj2_avail_out = t_avail_out;
	if (zip->codec2 == _7Z_X86_BCJ2) {
		/*
		 * Decord a remaining decompressed main stream for BCJ2.
		 */
		if (zip->tmp_stream_bytes_remaining) {
			ssize_t bytes;
			size_t remaining = zip->tmp_stream_bytes_remaining;
			bytes = Bcj2_Decode(zip, t_next_out, t_avail_out);
			if (bytes < 0) {
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "BCJ2 conversion Failed");
				return (ARCHIVE_FAILED);
			}
			zip->main_stream_bytes_remaining -=
			    remaining - zip->tmp_stream_bytes_remaining;
			t_avail_out -= bytes;
			if (o_avail_in == 0 || t_avail_out == 0) {
				*used = 0;
				*outbytes = o_avail_out - t_avail_out;
				if (o_avail_in == 0 &&
				    zip->tmp_stream_bytes_remaining)
					ret = ARCHIVE_EOF;
				return (ret);
			}
			t_next_out += bytes;
			bcj2_next_out = t_next_out;
			bcj2_avail_out = t_avail_out;
		}
		t_next_out = zip->tmp_stream_buff;
		t_avail_out = zip->tmp_stream_buff_size;
	}

	switch (zip->codec) {
	case _7Z_COPY:
	{
		size_t bytes =
		    (t_avail_in > t_avail_out)?t_avail_out:t_avail_in;

		memcpy(t_next_out, t_next_in, bytes);
		t_avail_in -= bytes;
		t_avail_out -= bytes;
		if (o_avail_in == 0)
			ret = ARCHIVE_EOF;
		break;
	}
#ifdef HAVE_LZMA_H
	case _7Z_LZMA: case _7Z_LZMA2:
		zip->lzstream.next_in = t_next_in;
		zip->lzstream.avail_in = t_avail_in;
		zip->lzstream.next_out = t_next_out;
		zip->lzstream.avail_out = t_avail_out;

		r = lzma_code(&(zip->lzstream), LZMA_RUN);
		switch (r) {
		case LZMA_STREAM_END: /* Found end of stream. */
			lzma_end(&(zip->lzstream));
			zip->lzstream_valid = 0;
			ret = ARCHIVE_EOF;
			break;
		case LZMA_OK: /* Decompressor made some progress. */
			break;
		default:
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
				"Decompression failed(%d)",
			    r);
			return (ARCHIVE_FAILED);
		}
		t_avail_in = zip->lzstream.avail_in;
		t_avail_out = zip->lzstream.avail_out;
		break;
#endif
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	case _7Z_BZ2:
		zip->bzstream.next_in = (char *)(uintptr_t)t_next_in;
		zip->bzstream.avail_in = t_avail_in;
		zip->bzstream.next_out = (char *)(uintptr_t)t_next_out;
		zip->bzstream.avail_out = t_avail_out;
		r = BZ2_bzDecompress(&(zip->bzstream));
		switch (r) {
		case BZ_STREAM_END: /* Found end of stream. */
			switch (BZ2_bzDecompressEnd(&(zip->bzstream))) {
			case BZ_OK:
				break;
			default:
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "Failed to clean up decompressor");
				return (ARCHIVE_FAILED);
			}
			zip->bzstream_valid = 0;
			ret = ARCHIVE_EOF;
			break;
		case BZ_OK: /* Decompressor made some progress. */
			break;
		default:
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "bzip decompression failed");
			return (ARCHIVE_FAILED);
		}
		t_avail_in = zip->bzstream.avail_in;
		t_avail_out = zip->bzstream.avail_out;
		break;
#endif
#ifdef HAVE_ZLIB_H
	case _7Z_DEFLATE:
		zip->stream.next_in = (Bytef *)(uintptr_t)t_next_in;
		zip->stream.avail_in = (uInt)t_avail_in;
		zip->stream.next_out = t_next_out;
		zip->stream.avail_out = (uInt)t_avail_out;
		r = inflate(&(zip->stream), 0);
		switch (r) {
		case Z_STREAM_END: /* Found end of stream. */
			ret = ARCHIVE_EOF;
			break;
		case Z_OK: /* Decompressor made some progress.*/
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "File decompression failed (%d)", r);
			return (ARCHIVE_FAILED);
		}
		t_avail_in = zip->stream.avail_in;
		t_avail_out = zip->stream.avail_out;
		break;
#endif
	case _7Z_PPMD:
	{
		uint64_t flush_bytes;

		if (!zip->ppmd7_valid || zip->ppmd7_stat < 0 ||
		    t_avail_out <= 0) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Decompression internal error");
			return (ARCHIVE_FAILED);
		}
		zip->ppstream.next_in = t_next_in;
		zip->ppstream.avail_in = t_avail_in;
		zip->ppstream.next_out = t_next_out;
		zip->ppstream.avail_out = t_avail_out;
		if (zip->ppmd7_stat == 0) {
			zip->bytein.a = a;
			zip->bytein.Read = &ppmd_read;
			zip->range_dec.Stream = &zip->bytein;
			r = __archive_ppmd7_functions.Ppmd7z_RangeDec_Init(
				&(zip->range_dec));
			if (r == 0) {
				zip->ppmd7_stat = -1;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Failed to initialize PPMd range decorder");
				return (ARCHIVE_FAILED);
			}
			if (zip->ppstream.overconsumed) {
				zip->ppmd7_stat = -1;
				return (ARCHIVE_FAILED);
			}
			zip->ppmd7_stat = 1;
		}

		if (t_avail_in == 0)
			/* XXX Flush out remaining decoded data XXX */
			flush_bytes = zip->folder_outbytes_remaining;
		else
			flush_bytes = 0;

		do {
			int sym;

			sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
				&(zip->ppmd7_context), &(zip->range_dec.p));
			if (sym < 0) {
				zip->ppmd7_stat = -1;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Failed to decode PPMd");
				return (ARCHIVE_FAILED);
			}
			if (zip->ppstream.overconsumed) {
				zip->ppmd7_stat = -1;
				return (ARCHIVE_FAILED);
			}
			*zip->ppstream.next_out++ = (unsigned char)sym;
			zip->ppstream.avail_out--;
			zip->ppstream.total_out++;
			if (flush_bytes)
				flush_bytes--;
		} while (zip->ppstream.avail_out &&
			(zip->ppstream.avail_in || flush_bytes));

		t_avail_in = (size_t)zip->ppstream.avail_in;
		t_avail_out = (size_t)zip->ppstream.avail_out;
		break;
	}
	default:
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "Decompression internal error");
		return (ARCHIVE_FAILED);
	}
	if (ret != ARCHIVE_OK && ret != ARCHIVE_EOF)
		return (ret);

	*used = o_avail_in - t_avail_in;
	*outbytes = o_avail_out - t_avail_out;

	/*
	 * Decord BCJ.
	 */
	if (zip->codec != _7Z_LZMA2 && zip->codec2 == _7Z_X86) {
		size_t l = x86_Convert(zip, buff, *outbytes);
		zip->odd_bcj_size = *outbytes - l;
		if (zip->odd_bcj_size > 0 && zip->odd_bcj_size <= 4 &&
		    o_avail_in && ret != ARCHIVE_EOF) {
			memcpy(zip->odd_bcj, ((unsigned char *)buff) + l,
			    zip->odd_bcj_size);
			*outbytes = l;
		} else
			zip->odd_bcj_size = 0;
	}

	/*
	 * Decord BCJ2 with a decompressed main stream.
	 */
	if (zip->codec2 == _7Z_X86_BCJ2) {
		ssize_t bytes;

		zip->tmp_stream_bytes_avail =
		    zip->tmp_stream_buff_size - t_avail_out;
		if (zip->tmp_stream_bytes_avail >
		      zip->main_stream_bytes_remaining)
			zip->tmp_stream_bytes_avail =
			    zip->main_stream_bytes_remaining;
		zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_avail;
		bytes = Bcj2_Decode(zip, bcj2_next_out, bcj2_avail_out);
		if (bytes < 0) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "BCJ2 conversion Failed");
			return (ARCHIVE_FAILED);
		}
		zip->main_stream_bytes_remaining -=
		    zip->tmp_stream_bytes_avail
		      - zip->tmp_stream_bytes_remaining;
		bcj2_avail_out -= bytes;
		*outbytes = o_avail_out - bcj2_avail_out;
	}

	return (ret);
}